

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

void helper_msa_nlzc_h_mips64el(CPUMIPSState_conflict10 *env,uint32_t wd,uint32_t ws)

{
  fpr_t *pfVar1;
  fpr_t *pfVar2;
  int64_t iVar3;
  wr_t *pws;
  wr_t *pwd;
  uint32_t ws_local;
  uint32_t wd_local;
  CPUMIPSState_conflict10 *env_local;
  
  pfVar1 = (env->active_fpu).fpr + wd;
  pfVar2 = (env->active_fpu).fpr + ws;
  iVar3 = msa_nlzc_df(1,(long)*(short *)pfVar2);
  *(short *)pfVar1 = (short)iVar3;
  iVar3 = msa_nlzc_df(1,(long)*(short *)((long)pfVar2 + 2));
  *(short *)((long)pfVar1 + 2) = (short)iVar3;
  iVar3 = msa_nlzc_df(1,(long)*(short *)((long)pfVar2 + 4));
  *(short *)((long)pfVar1 + 4) = (short)iVar3;
  iVar3 = msa_nlzc_df(1,(long)*(short *)((long)pfVar2 + 6));
  *(short *)((long)pfVar1 + 6) = (short)iVar3;
  iVar3 = msa_nlzc_df(1,(long)*(short *)((long)pfVar2 + 8));
  *(short *)((long)pfVar1 + 8) = (short)iVar3;
  iVar3 = msa_nlzc_df(1,(long)*(short *)((long)pfVar2 + 10));
  *(short *)((long)pfVar1 + 10) = (short)iVar3;
  iVar3 = msa_nlzc_df(1,(long)*(short *)((long)pfVar2 + 0xc));
  *(short *)((long)pfVar1 + 0xc) = (short)iVar3;
  iVar3 = msa_nlzc_df(1,(long)*(short *)((long)pfVar2 + 0xe));
  *(short *)((long)pfVar1 + 0xe) = (short)iVar3;
  return;
}

Assistant:

void helper_msa_nlzc_h(CPUMIPSState *env, uint32_t wd, uint32_t ws)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);

    pwd->h[0]  = msa_nlzc_df(DF_HALF, pws->h[0]);
    pwd->h[1]  = msa_nlzc_df(DF_HALF, pws->h[1]);
    pwd->h[2]  = msa_nlzc_df(DF_HALF, pws->h[2]);
    pwd->h[3]  = msa_nlzc_df(DF_HALF, pws->h[3]);
    pwd->h[4]  = msa_nlzc_df(DF_HALF, pws->h[4]);
    pwd->h[5]  = msa_nlzc_df(DF_HALF, pws->h[5]);
    pwd->h[6]  = msa_nlzc_df(DF_HALF, pws->h[6]);
    pwd->h[7]  = msa_nlzc_df(DF_HALF, pws->h[7]);
}